

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssxmlExporter.cpp
# Opt level: O1

int Assimp::AssxmlExport::ioprintf(IOStream *io,char *format,...)

{
  char in_AL;
  uint uVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  char sz [4096];
  undefined8 local_10f8;
  void **local_10f0;
  undefined1 *local_10e8;
  undefined1 local_10d8 [16];
  undefined8 local_10c8;
  undefined8 local_10c0;
  undefined8 local_10b8;
  undefined8 local_10b0;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  undefined8 local_1038;
  char local_1028 [4104];
  
  if (in_AL != '\0') {
    local_10a8 = in_XMM0_Qa;
    local_1098 = in_XMM1_Qa;
    local_1088 = in_XMM2_Qa;
    local_1078 = in_XMM3_Qa;
    local_1068 = in_XMM4_Qa;
    local_1058 = in_XMM5_Qa;
    local_1048 = in_XMM6_Qa;
    local_1038 = in_XMM7_Qa;
  }
  local_10c8 = in_RDX;
  local_10c0 = in_RCX;
  local_10b8 = in_R8;
  local_10b0 = in_R9;
  memset(local_1028,0,0x1000);
  local_10f0 = &va[0].overflow_arg_area;
  local_10f8 = 0x3000000010;
  local_10e8 = local_10d8;
  uVar1 = vsnprintf(local_1028,0xfff,format,&local_10f8);
  if (uVar1 < 0x1000) {
    iVar2 = (*io->_vptr_IOStream[3])(io,local_1028,1,(ulong)uVar1);
    return iVar2;
  }
  __assert_fail("nSize < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assxml/AssxmlExporter.cpp"
                ,0x56,"int Assimp::AssxmlExport::ioprintf(IOStream *, const char *, ...)");
}

Assistant:

static int ioprintf( IOStream * io, const char *format, ... ) {
	using namespace std;
    if ( nullptr == io ) {
        return -1;
    }

    static const int Size = 4096;
    char sz[ Size ];
    ::memset( sz, '\0', Size );
    va_list va;
    va_start( va, format );
    const unsigned int nSize = vsnprintf( sz, Size-1, format, va );
    ai_assert( nSize < Size );
    va_end( va );

    io->Write( sz, sizeof(char), nSize );

    return nSize;
}